

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  int iVar1;
  ImGuiWindow *ref_window;
  bool bVar2;
  long lVar3;
  ImGuiContext *pIVar4;
  ImGuiID IVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *window;
  
  pIVar4 = GImGui;
  iVar1 = (GImGui->WindowsFocusOrder).Size;
  uVar6 = iVar1 - 1;
  lVar7 = (long)iVar1;
  if (under_this_window != (ImGuiWindow *)0x0) {
    do {
      if (lVar7 < 1) {
        lVar8 = 0xffffffff;
        break;
      }
      lVar8 = lVar7 + -1;
      lVar3 = lVar7 + -1;
      lVar7 = lVar8;
    } while ((GImGui->WindowsFocusOrder).Data[lVar3] != under_this_window);
    if ((int)lVar8 != -1) {
      uVar6 = (int)lVar8 - 1;
    }
  }
  if ((int)uVar6 < 0) {
    FocusWindow((ImGuiWindow *)0x0);
    return;
  }
  lVar7 = (ulong)uVar6 + 1;
  while (((pIVar9 = (GImGui->WindowsFocusOrder).Data[lVar7 + -1], pIVar9 == ignore_window ||
          (pIVar9->WasActive != true)) ||
         ((~pIVar9->Flags & 0x40200U) == 0 || (pIVar9->Flags & 0x1000000U) != 0))) {
    lVar8 = lVar7 + -1;
    bVar2 = lVar7 < 1;
    lVar7 = lVar8;
    if (lVar8 == 0 || bVar2) {
      FocusWindow((ImGuiWindow *)0x0);
      return;
    }
  }
  ref_window = pIVar9->NavLastChildNavWindow;
  if ((ref_window != (ImGuiWindow *)0x0) && (ref_window->WasActive != false)) {
    if (GImGui->NavWindow != ref_window) {
      GImGui->NavWindow = ref_window;
      if (ref_window == (ImGuiWindow *)0x0) {
        pIVar4->NavInitRequest = false;
        IVar5 = 0;
      }
      else {
        if (pIVar4->NavDisableMouseHover == true) {
          pIVar4->NavMousePosDirty = true;
        }
        pIVar4->NavInitRequest = false;
        IVar5 = ref_window->NavLastIds[0];
      }
      pIVar4->NavId = IVar5;
      pIVar4->NavFocusScopeId = 0;
      pIVar4->NavIdIsAlive = false;
      pIVar4->NavLayer = ImGuiNavLayer_Main;
    }
    pIVar9 = (ImGuiWindow *)0x0;
    ClosePopupsOverWindow(ref_window,false);
    if (ref_window == (ImGuiWindow *)0x0) {
      window = (ImGuiWindow *)0x0;
    }
    else {
      pIVar9 = ref_window->RootWindow;
      window = ref_window->RootWindow;
    }
    if (((pIVar4->ActiveId != 0) && (pIVar4->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       ((pIVar4->ActiveIdWindow->RootWindow != pIVar9 &&
        (pIVar4->ActiveIdNoClearOnFocusLoss == false)))) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
    if ((ref_window != (ImGuiWindow *)0x0) &&
       (BringWindowToFocusFront(pIVar9), ((uint)(window->Flags | ref_window->Flags) >> 0xd & 1) == 0
       )) {
      BringWindowToDisplayFront(window);
      return;
    }
    return;
  }
  FocusWindow(pIVar9);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}